

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_throttle_configure
               (ENetPeer *peer,enet_uint32 interval,enet_uint32 acceleration,
               enet_uint32 deceleration)

{
  undefined1 local_4c [8];
  ENetProtocol command;
  enet_uint32 deceleration_local;
  enet_uint32 acceleration_local;
  enet_uint32 interval_local;
  ENetPeer *peer_local;
  
  peer->packetThrottleInterval = interval;
  peer->packetThrottleAcceleration = acceleration;
  peer->packetThrottleDeceleration = deceleration;
  local_4c[0] = 0x8b;
  local_4c[1] = 0xff;
  command.connect.connectID = deceleration;
  command.connect.data = acceleration;
  deceleration_local = interval;
  _acceleration_local = peer;
  local_4c._4_4_ = htonl(interval);
  command.header = (ENetProtocolCommandHeader)htonl(command.connect.data);
  command.disconnect.data = htonl(command.connect.connectID);
  enet_peer_queue_outgoing_command
            (_acceleration_local,(ENetProtocol *)local_4c,(ENetPacket *)0x0,0,0);
  return;
}

Assistant:

void enet_peer_throttle_configure(ENetPeer *peer, enet_uint32 interval, enet_uint32 acceleration, enet_uint32 deceleration) {
        ENetProtocol command;

        peer->packetThrottleInterval     = interval;
        peer->packetThrottleAcceleration = acceleration;
        peer->packetThrottleDeceleration = deceleration;

        command.header.command   = (int)ENET_PROTOCOL_COMMAND_THROTTLE_CONFIGURE | (int)ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        command.header.channelID = 0xFF;

        command.throttleConfigure.packetThrottleInterval     = ENET_HOST_TO_NET_32(interval);
        command.throttleConfigure.packetThrottleAcceleration = ENET_HOST_TO_NET_32(acceleration);
        command.throttleConfigure.packetThrottleDeceleration = ENET_HOST_TO_NET_32(deceleration);

        enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
    }